

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O0

void __thiscall FatSystem::enableWrite(FatSystem *this)

{
  int iVar1;
  char *__file;
  ostream *poVar2;
  undefined8 uVar3;
  ostringstream local_188 [8];
  ostringstream oss;
  FatSystem *this_local;
  
  close(this->fd);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = open(__file,2);
  this->fd = iVar1;
  if (this->fd < 0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    poVar2 = std::operator<<((ostream *)local_188,"! Unable to open the input file: ");
    poVar2 = std::operator<<(poVar2,(string *)this);
    std::operator<<(poVar2," for writing");
    uVar3 = __cxa_allocate_exception(0x20);
    std::__cxx11::ostringstream::str();
    __cxa_throw(uVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  this->writeMode = true;
  return;
}

Assistant:

void FatSystem::enableWrite()
{
    close(fd);
    fd = open(filename.c_str(), O_RDWR|O_LARGEFILE);

    if (fd < 0) {
        ostringstream oss;
        oss << "! Unable to open the input file: " << filename << " for writing";

        throw oss.str();
    }

    writeMode = true;
}